

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::RelinkFailure::VertexShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_19;
  void *local_18;
  RelinkFailure *this_local;
  
  local_18 = this;
  this_local = (RelinkFailure *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 430                                  \nin vec4 position;                             \nin vec3 pos;                                  \nvoid main(void)                               \n{                                             \n    gl_Position = position + vec4(pos, 1);    \n}"
             ,&local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string VertexShader()
	{
		return "#version 430                                  \n"
			   "in vec4 position;                             \n"
			   "in vec3 pos;                                  \n"
			   "void main(void)                               \n"
			   "{                                             \n"
			   "    gl_Position = position + vec4(pos, 1);    \n"
			   "}";
	}